

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DateFormatSymbols::setNarrowEras
          (DateFormatSymbols *this,UnicodeString *narrowErasArray,int32_t count)

{
  UnicodeString *this_00;
  UnicodeString *pUVar1;
  UnicodeString *p;
  int32_t count_local;
  UnicodeString *narrowErasArray_local;
  DateFormatSymbols *this_local;
  
  if ((this->fNarrowEras != (UnicodeString *)0x0) &&
     (pUVar1 = this->fNarrowEras, pUVar1 != (UnicodeString *)0x0)) {
    this_00 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    p = narrowErasArray;
    while (pUVar1 != this_00) {
      this_00 = this_00 + -1;
      icu_63::UnicodeString::~UnicodeString(this_00);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),p);
  }
  pUVar1 = newUnicodeStringArray((long)count);
  this->fNarrowEras = pUVar1;
  uprv_arrayCopy(narrowErasArray,this->fNarrowEras,count);
  this->fNarrowErasCount = count;
  return;
}

Assistant:

void
DateFormatSymbols::setNarrowEras(const UnicodeString* narrowErasArray, int32_t count)
{
    // delete the old list if we own it
    if (fNarrowEras)
        delete[] fNarrowEras;

    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)
    fNarrowEras = newUnicodeStringArray(count);
    uprv_arrayCopy(narrowErasArray,fNarrowEras,  count);
    fNarrowErasCount = count;
}